

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Walk.cpp
# Opt level: O0

void Handlers::Walk_Admin(Character *character,PacketReader *reader)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  mapped_type *this;
  allocator<char> local_39;
  key_type local_38;
  Character *local_18;
  PacketReader *reader_local;
  Character *character_local;
  
  local_18 = (Character *)reader;
  reader_local = (PacketReader *)character;
  uVar2 = (*(character->super_Command_Source)._vptr_Command_Source[1])();
  lVar1 = *(long *)&reader_local[0x1a].data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"nowall",&local_39);
  this = std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
         ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       *)(lVar1 + 0x1f0),&local_38);
  iVar3 = util::variant::operator_cast_to_int(this);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (iVar3 <= (int)(uVar2 & 0xff)) {
    walk_common((Handlers *)reader_local,local_18,(PacketReader *)Character::AdminWalk,0);
  }
  return;
}

Assistant:

void Walk_Admin(Character *character, PacketReader &reader)
{
	if (character->SourceDutyAccess() < int(character->world->admin_config["nowall"]))
		return;

	walk_common(character, reader, &Character::AdminWalk);
}